

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O3

void __thiscall MT32Emu::Synth::deleteMemoryRegions(Synth *this)

{
  operator_delete(this->patchTempMemoryRegion);
  this->patchTempMemoryRegion = (PatchTempMemoryRegion *)0x0;
  operator_delete(this->rhythmTempMemoryRegion);
  this->rhythmTempMemoryRegion = (RhythmTempMemoryRegion *)0x0;
  operator_delete(this->timbreTempMemoryRegion);
  this->timbreTempMemoryRegion = (TimbreTempMemoryRegion *)0x0;
  operator_delete(this->patchesMemoryRegion);
  this->patchesMemoryRegion = (PatchesMemoryRegion *)0x0;
  operator_delete(this->timbresMemoryRegion);
  this->timbresMemoryRegion = (TimbresMemoryRegion *)0x0;
  operator_delete(this->systemMemoryRegion);
  this->systemMemoryRegion = (SystemMemoryRegion *)0x0;
  operator_delete(this->displayMemoryRegion);
  this->displayMemoryRegion = (DisplayMemoryRegion *)0x0;
  operator_delete(this->resetMemoryRegion);
  this->resetMemoryRegion = (ResetMemoryRegion *)0x0;
  if (this->paddedTimbreMaxTable != (Bit8u *)0x0) {
    operator_delete__(this->paddedTimbreMaxTable);
  }
  this->paddedTimbreMaxTable = (Bit8u *)0x0;
  return;
}

Assistant:

void Synth::deleteMemoryRegions() {
	delete patchTempMemoryRegion;
	patchTempMemoryRegion = NULL;
	delete rhythmTempMemoryRegion;
	rhythmTempMemoryRegion = NULL;
	delete timbreTempMemoryRegion;
	timbreTempMemoryRegion = NULL;
	delete patchesMemoryRegion;
	patchesMemoryRegion = NULL;
	delete timbresMemoryRegion;
	timbresMemoryRegion = NULL;
	delete systemMemoryRegion;
	systemMemoryRegion = NULL;
	delete displayMemoryRegion;
	displayMemoryRegion = NULL;
	delete resetMemoryRegion;
	resetMemoryRegion = NULL;

	delete[] paddedTimbreMaxTable;
	paddedTimbreMaxTable = NULL;
}